

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bz2_stream.cpp
# Opt level: O1

ssize_t __thiscall minibag::BZ2Stream::write(BZ2Stream *this,int __fd,void *__buf,size_t __n)

{
  uint64_t uVar1;
  ssize_t extraout_RAX;
  runtime_error *prVar2;
  undefined4 in_register_00000034;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->bzfile_ == (BZFILE *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"cannot write to unopened bzfile","");
    std::runtime_error::runtime_error(prVar2,(string *)local_40);
    *(undefined ***)prVar2 = &PTR__runtime_error_001506a0;
    __cxa_throw(prVar2,&BagException::typeinfo,std::runtime_error::~runtime_error);
  }
  BZ2_bzWrite(&this->bzerror_,this->bzfile_,(void *)CONCAT44(in_register_00000034,__fd),(int)__buf);
  if (this->bzerror_ != -6) {
    uVar1 = Stream::getCompressedIn(&this->super_Stream);
    Stream::setCompressedIn(&this->super_Stream,(long)__buf + uVar1);
    return extraout_RAX;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"BZ_IO_ERROR: error writing the compressed file","");
  std::runtime_error::runtime_error(prVar2,(string *)local_40);
  *(undefined ***)prVar2 = &PTR__runtime_error_001506a0;
  __cxa_throw(prVar2,&BagException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BZ2Stream::write(void* ptr, size_t size) {
    if (!bzfile_) {
        throw BagException("cannot write to unopened bzfile");
    }

    BZ2_bzWrite(&bzerror_, bzfile_, ptr, (int)size);

    switch (bzerror_) {
    case BZ_IO_ERROR: throw BagException("BZ_IO_ERROR: error writing the compressed file");
    }

    setCompressedIn(getCompressedIn() + size);
}